

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

void __thiscall cs::token_signal::token_signal(token_signal *this,signal_types t)

{
  compile_error *this_00;
  allocator local_31;
  string local_30;
  
  (this->super_token_base).line_num = 1;
  (this->super_token_base)._vptr_token_base = (_func_int **)&PTR__token_base_0023eef8;
  this->mType = t;
  if (t != error_) {
    return;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Unknown signal.",&local_31);
  compile_error::compile_error(this_00,&local_30);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

token_base(const token_base &) = default;